

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O0

void __thiscall myutils::IpcConnection::do_recv(IpcConnection *this)

{
  uint uVar1;
  int in_ECX;
  int local_24;
  undefined8 uStack_20;
  int i;
  size_t size;
  char *data;
  IpcConnection *this_local;
  
  if (this->m_recv_queue != (ShmemQueue *)0x0) {
    local_24 = 0;
    data = (char *)this;
    while ((local_24 < 10 &&
           (uVar1 = ShmemQueue::poll(this->m_recv_queue,(pollfd *)&size,
                                     (nfds_t)&stack0xffffffffffffffe0,in_ECX), (uVar1 & 1) != 0))) {
      if (this->m_callback != (Connection_Callback *)0x0) {
        (**this->m_callback->_vptr_Connection_Callback)(this->m_callback,size,uStack_20);
      }
      ShmemQueue::pop(this->m_recv_queue);
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

void IpcConnection::do_recv()
{
    if (!m_recv_queue) return;

    const char* data;
    size_t size;

    // at most read 10 msgs in one loop
    for (int i = 0; i < 10; i++) {
        if (m_recv_queue->poll(&data, &size) ) {
            if (m_callback)
                m_callback->on_recv(data, size);
            m_recv_queue->pop();
        }
        else {
            break;
        }
    }
}